

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O2

Value __thiscall lsim::Simulator::read_pin(Simulator *this,pin_t pin)

{
  pointer puVar1;
  Value VVar2;
  
  puVar1 = (this->m_pin_nodes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)pin <
      (ulong)((long)(this->m_pin_nodes).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar1 >> 2)) {
    VVar2 = read_node(this,puVar1[pin]);
    return VVar2;
  }
  __assert_fail("pin < m_pin_nodes.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                ,0x5d,"Value lsim::Simulator::read_pin(pin_t) const");
}

Assistant:

Value Simulator::read_pin(pin_t pin) const {
    assert(pin < m_pin_nodes.size());

    auto node_id = m_pin_nodes[pin];
    return read_node(node_id);
}